

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall LatencyItem::~LatencyItem(LatencyItem *this)

{
  Histogram::~Histogram(&this->hist);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LatencyItem() {}